

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_bases.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ZeroFieldsBase::InternalSwap(ZeroFieldsBase *this,ZeroFieldsBase *other)

{
  ZeroFieldsBase *other_local;
  ZeroFieldsBase *this_local;
  
  InternalMetadata::Swap<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,
             &(other->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

void ZeroFieldsBase::InternalSwap(ZeroFieldsBase* other) {
  _internal_metadata_.Swap<UnknownFieldSet>(&other->_internal_metadata_);
}